

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O3

wchar_t compute_tree_penalty(player *p)

{
  bitflag *flags;
  _Bool _Var1;
  wchar_t wVar2;
  
  flags = (p->state).pflags;
  _Var1 = flag_has_dbg(flags,10,0x13,"p->state.pflags","(PF_WOODEN)");
  if (!_Var1) {
    _Var1 = flag_has_dbg(flags,10,0x30,"p->state.pflags","(PF_WOODSMAN)");
    if (!_Var1) {
      _Var1 = flag_has_dbg(flags,10,0x11,"p->state.pflags","(PF_FLYING)");
      if (!_Var1) {
        _Var1 = flag_has_dbg(flags,10,0x16,"p->state.pflags","(PF_ELVEN)");
        if (!_Var1) {
          wVar2 = convert_turn_penalty(L'\x10',p);
          return wVar2;
        }
      }
    }
  }
  return L'\0';
}

Assistant:

static int compute_tree_penalty(struct player *p)
{
	/* Ents, elves, druids, rangers, flyers can move easily */
	if (player_has(p, PF_WOODEN) || player_has(p, PF_WOODSMAN) ||
		player_has(p, PF_FLYING) || player_has(p, PF_ELVEN)) {
		return 0;
	}

	/* Otherwise take one extra turn. */
	return convert_turn_penalty(PF_SCL, p);
}